

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O0

FT_Long cff_parse_num(CFF_Parser parser,FT_Byte **d)

{
  FT_Fixed FVar1;
  FT_Byte **d_local;
  CFF_Parser parser_local;
  
  if (**d == '\x1e') {
    FVar1 = cff_parse_real(parser,*d,0,(FT_Long *)0x0);
    parser_local = (CFF_Parser)(FVar1 >> 0x10);
  }
  else if (**d == 0xff) {
    parser_local = (CFF_Parser)
                   (long)(short)(((uint)(*d)[1] << 0x10 | (uint)(*d)[2] << 8 | (uint)(*d)[3]) + 0x80
                                >> 8);
  }
  else {
    parser_local = (CFF_Parser)cff_parse_integer(parser,*d);
  }
  return (FT_Long)parser_local;
}

Assistant:

FT_LOCAL_DEF( FT_Long )
  cff_parse_num( CFF_Parser  parser,
                 FT_Byte**   d )
  {
    if ( **d == 30 )
    {
      /* binary-coded decimal is truncated to integer */
      return cff_parse_real( parser, *d, 0, NULL ) >> 16;
    }

    else if ( **d == 255 )
    {
      /* 16.16 fixed-point is used internally for CFF2 blend results. */
      /* Since these are trusted values, a limit check is not needed. */

      /* After the 255, 4 bytes give the number.                 */
      /* The blend value is converted to integer, with rounding; */
      /* due to the right-shift we don't need the lowest byte.   */
#if 0
      return (FT_Short)(
               ( ( ( (FT_UInt32)*( d[0] + 1 ) << 24 ) |
                   ( (FT_UInt32)*( d[0] + 2 ) << 16 ) |
                   ( (FT_UInt32)*( d[0] + 3 ) <<  8 ) |
                     (FT_UInt32)*( d[0] + 4 )         ) + 0x8000U ) >> 16 );
#else
      return (FT_Short)(
               ( ( ( (FT_UInt32)*( d[0] + 1 ) << 16 ) |
                   ( (FT_UInt32)*( d[0] + 2 ) <<  8 ) |
                     (FT_UInt32)*( d[0] + 3 )         ) + 0x80U ) >> 8 );
#endif
    }

    else
      return cff_parse_integer( parser, *d );
  }